

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Appearance_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::Appearance_PDU::SetAppearanceIRFlag(Appearance_PDU *this,KBOOL F)

{
  if ((((this->m_AppearanceFlag1Union).m_ui8Flag & 0x40) == 0) == F) {
    (this->m_AppearanceFlag1Union).m_ui8Flag =
         (this->m_AppearanceFlag1Union).m_ui8Flag & 0xbf | F << 6;
    (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength =
         ((ushort)F * 8 + (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength) - 4;
  }
  return;
}

Assistant:

void Appearance_PDU::SetAppearanceIRFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_AppearanceFlag1Union.m_ui8IR )return;

    m_AppearanceFlag1Union.m_ui8IR = F;

    if( F )
    {
        m_ui16PDULength += EntityAppearance::ENTITY_APPEARANCE_SIZE;
    }
    else
    {
        m_ui16PDULength -= EntityAppearance::ENTITY_APPEARANCE_SIZE;
    }
}